

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.cpp
# Opt level: O0

void __thiscall HFactor::ftranFT(HFactor *this,HVector *vector)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  double *pdVar5;
  size_type sVar6;
  int *piVar7;
  int *piVar8;
  int *piVar9;
  double *pdVar10;
  long in_RSI;
  long in_RDI;
  HighsInt k;
  HighsInt end;
  HighsInt start;
  double value1;
  double value0;
  HighsInt iRow;
  HighsInt i;
  double *pf_value;
  HighsInt *pf_index;
  HighsInt *pf_start;
  HighsInt *pf_pivot_index;
  HighsInt pf_pivot_count;
  double *rhs_array;
  HighsInt *rhs_index;
  HighsInt rhs_count;
  double local_88;
  int local_74;
  double local_68;
  int local_54;
  int local_14;
  
  local_14 = *(int *)(in_RSI + 4);
  piVar4 = std::vector<int,_std::allocator<int>_>::data
                     ((vector<int,_std::allocator<int>_> *)0x7d4d6b);
  pdVar5 = std::vector<double,_std::allocator<double>_>::data
                     ((vector<double,_std::allocator<double>_> *)0x7d4d7e);
  sVar6 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x668));
  iVar3 = (int)sVar6;
  piVar7 = std::vector<int,_std::allocator<int>_>::data
                     ((vector<int,_std::allocator<int>_> *)0x7d4da9);
  piVar8 = std::vector<int,_std::allocator<int>_>::data
                     ((vector<int,_std::allocator<int>_> *)0x7d4dbf);
  piVar9 = std::vector<int,_std::allocator<int>_>::data
                     ((vector<int,_std::allocator<int>_> *)0x7d4dd5);
  pdVar10 = std::vector<double,_std::allocator<double>_>::data
                      ((vector<double,_std::allocator<double>_> *)0x7d4deb);
  for (local_54 = 0; local_54 < iVar3; local_54 = local_54 + 1) {
    iVar2 = piVar7[local_54];
    dVar1 = pdVar5[iVar2];
    local_68 = dVar1;
    for (local_74 = piVar8[local_54]; local_74 < piVar8[local_54 + 1]; local_74 = local_74 + 1) {
      local_68 = -pdVar5[piVar9[local_74]] * pdVar10[local_74] + local_68;
    }
    if ((((dVar1 != 0.0) || (NAN(dVar1))) || (local_68 != 0.0)) || (NAN(local_68))) {
      if ((dVar1 == 0.0) && (!NAN(dVar1))) {
        piVar4[local_14] = iVar2;
        local_14 = local_14 + 1;
      }
      if (1e-14 <= ABS(local_68)) {
        local_88 = local_68;
      }
      else {
        local_88 = 1e-50;
      }
      pdVar5[iVar2] = local_88;
    }
  }
  *(int *)(in_RSI + 4) = local_14;
  *(double *)(in_RSI + 0x38) =
       (double)(iVar3 * 0x14 + piVar8[iVar3] * 5) + *(double *)(in_RSI + 0x38);
  if (piVar8[iVar3] / (iVar3 + 1) < 5) {
    *(double *)(in_RSI + 0x38) = (double)(piVar8[iVar3] * 5) + *(double *)(in_RSI + 0x38);
  }
  return;
}

Assistant:

void HFactor::ftranFT(HVector& vector) const {
  // Alias to non constant
  assert(vector.count >= 0);
  HighsInt rhs_count = vector.count;
  HighsInt* rhs_index = vector.index.data();
  double* rhs_array = vector.array.data();
  // Alias to PF buffer
  const HighsInt pf_pivot_count = pf_pivot_index.size();
  const HighsInt* pf_pivot_index = this->pf_pivot_index.data();
  const HighsInt* pf_start = this->pf_start.data();
  const HighsInt* pf_index = this->pf_index.data();
  const double* pf_value = this->pf_value.data();
  for (HighsInt i = 0; i < pf_pivot_count; i++) {
    HighsInt iRow = pf_pivot_index[i];
    double value0 = rhs_array[iRow];
    double value1 = value0;
    const HighsInt start = pf_start[i];
    const HighsInt end = pf_start[i + 1];
    for (HighsInt k = start; k < end; k++)
      value1 -= rhs_array[pf_index[k]] * pf_value[k];
    // This would skip the situation where they are both zeros
    if (value0 || value1) {
      if (value0 == 0) rhs_index[rhs_count++] = iRow;
      rhs_array[iRow] = (fabs(value1) < kHighsTiny) ? kHighsZero : value1;
    }
  }
  // Save count back
  vector.count = rhs_count;
  vector.synthetic_tick += pf_pivot_count * 20 + pf_start[pf_pivot_count] * 5;
  if (pf_start[pf_pivot_count] / (pf_pivot_count + 1) < 5) {
    vector.synthetic_tick += pf_start[pf_pivot_count] * 5;
  }
}